

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

void __thiscall
udpdiscovery::impl::PeerEnv::processReceivedBuffer
          (PeerEnv *this,long cur_time_ms,IpPort *from,string *buffer)

{
  bool bVar1;
  ProtocolVersion PVar2;
  ProtocolVersion PVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  SamePeerMode mode;
  PacketType PVar6;
  reference pDVar7;
  reference pDVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  string *psVar11;
  _Self local_e8;
  undefined1 local_d9;
  undefined1 auStack_d8 [7];
  bool update_user_data;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  uint64_t uStack_b0;
  long local_a8;
  _Self local_a0;
  IpPort local_98;
  _Self local_90;
  _Self local_88;
  iterator it;
  iterator find_it;
  bool accept_packet;
  bool is_supported_packet_version;
  undefined1 local_60 [4];
  ProtocolVersion packet_version;
  Packet packet;
  string *buffer_local;
  IpPort *from_local;
  long cur_time_ms_local;
  PeerEnv *this_local;
  
  packet._48_8_ = buffer;
  Packet::Packet((Packet *)local_60);
  PVar2 = Packet::Parse((Packet *)local_60,(string *)packet._48_8_);
  PVar3 = PeerParameters::min_supported_protocol_version(&this->parameters_);
  bVar1 = false;
  if ((int)PVar3 <= (int)PVar2) {
    PVar3 = PeerParameters::max_supported_protocol_version(&this->parameters_);
    bVar1 = (int)PVar2 <= (int)PVar3;
  }
  if ((PVar2 != kProtocolVersionUnknown) && (bVar1)) {
    bVar1 = false;
    uVar4 = PeerParameters::application_id(&this->parameters_);
    uVar5 = Packet::application_id((Packet *)local_60);
    if (uVar4 == uVar5) {
      bVar1 = PeerParameters::discover_self(&this->parameters_);
      if (bVar1) {
        bVar1 = true;
      }
      else {
        uVar4 = Packet::peer_id((Packet *)local_60);
        bVar1 = uVar4 != this->peer_id_;
      }
    }
    if (bVar1) {
      MinimalisticMutex::Lock(&this->lock_);
      it = std::__cxx11::
           list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::end
                     (&this->discovered_peers_);
      local_88._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::begin
                     (&this->discovered_peers_);
      while( true ) {
        local_90._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::end
                       (&this->discovered_peers_);
        bVar1 = std::operator!=(&local_88,&local_90);
        if (!bVar1) break;
        mode = PeerParameters::same_peer_mode(&this->parameters_);
        pDVar8 = std::_List_iterator<udpdiscovery::DiscoveredPeer>::operator*(&local_88);
        local_98 = DiscoveredPeer::ip_port(pDVar8);
        bVar1 = Same(mode,&local_98,from);
        if (bVar1) {
          it._M_node = local_88._M_node;
          break;
        }
        std::_List_iterator<udpdiscovery::DiscoveredPeer>::operator++(&local_88);
      }
      PVar6 = Packet::packet_type((Packet *)local_60);
      if (PVar6 == kPacketIAmHere) {
        local_a0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::end
                       (&this->discovered_peers_);
        bVar1 = std::operator==(&it,&local_a0);
        if (bVar1) {
          local_b8 = 0;
          uStack_b0 = 0;
          local_c8 = 0;
          uStack_c0 = 0;
          auStack_d8._0_4_ = 0;
          stack0xffffffffffffff2c = 0;
          uStack_d0._0_1_ = (string)0x0;
          uStack_d0._1_7_ = 0;
          local_a8 = 0;
          DiscoveredPeer::DiscoveredPeer((DiscoveredPeer *)auStack_d8);
          std::__cxx11::
          list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::
          push_back(&this->discovered_peers_,(value_type *)auStack_d8);
          DiscoveredPeer::~DiscoveredPeer((DiscoveredPeer *)auStack_d8);
          pDVar7 = std::__cxx11::
                   list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                   ::back(&this->discovered_peers_);
          DiscoveredPeer::set_ip_port(pDVar7,from);
          pDVar7 = std::__cxx11::
                   list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                   ::back(&this->discovered_peers_);
          psVar11 = Packet::user_data_abi_cxx11_((Packet *)local_60);
          uVar9 = Packet::snapshot_index((Packet *)local_60);
          DiscoveredPeer::SetUserData(pDVar7,psVar11,uVar9);
          pDVar7 = std::__cxx11::
                   list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                   ::back(&this->discovered_peers_);
          DiscoveredPeer::set_last_updated(pDVar7,cur_time_ms);
        }
        else {
          pDVar8 = std::_List_iterator<udpdiscovery::DiscoveredPeer>::operator*(&it);
          uVar9 = DiscoveredPeer::last_received_packet(pDVar8);
          uVar10 = Packet::snapshot_index((Packet *)local_60);
          local_d9 = uVar9 < uVar10;
          if ((bool)local_d9) {
            pDVar8 = std::_List_iterator<udpdiscovery::DiscoveredPeer>::operator*(&it);
            psVar11 = Packet::user_data_abi_cxx11_((Packet *)local_60);
            uVar9 = Packet::snapshot_index((Packet *)local_60);
            DiscoveredPeer::SetUserData(pDVar8,psVar11,uVar9);
          }
          pDVar8 = std::_List_iterator<udpdiscovery::DiscoveredPeer>::operator*(&it);
          DiscoveredPeer::set_last_updated(pDVar8,cur_time_ms);
        }
      }
      else {
        PVar6 = Packet::packet_type((Packet *)local_60);
        if (PVar6 == kPacketIAmOutOfHere) {
          local_e8._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::
               end(&this->discovered_peers_);
          bVar1 = std::operator!=(&it,&local_e8);
          if (bVar1) {
            std::__cxx11::
            list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::erase
                      (&this->discovered_peers_,it);
          }
        }
      }
      MinimalisticMutex::Unlock(&this->lock_);
    }
  }
  Packet::~Packet((Packet *)local_60);
  return;
}

Assistant:

void processReceivedBuffer(long cur_time_ms, const IpPort& from,
                             const std::string& buffer) {
    Packet packet;

    ProtocolVersion packet_version = packet.Parse(buffer);
    bool is_supported_packet_version =
        (packet_version >= parameters_.min_supported_protocol_version() &&
         packet_version <= parameters_.max_supported_protocol_version());

    if (packet_version != kProtocolVersionUnknown &&
        is_supported_packet_version) {
      bool accept_packet = false;
      if (parameters_.application_id() == packet.application_id()) {
        if (!parameters_.discover_self()) {
          if (packet.peer_id() != peer_id_) {
            accept_packet = true;
          }
        } else {
          accept_packet = true;
        }
      }

      if (accept_packet) {
        lock_.Lock();

        std::list<DiscoveredPeer>::iterator find_it = discovered_peers_.end();
        for (std::list<DiscoveredPeer>::iterator it = discovered_peers_.begin();
             it != discovered_peers_.end(); ++it) {
          if (Same(parameters_.same_peer_mode(), (*it).ip_port(), from)) {
            find_it = it;
            break;
          }
        }

        if (packet.packet_type() == kPacketIAmHere) {
          if (find_it == discovered_peers_.end()) {
            discovered_peers_.push_back(DiscoveredPeer());
            discovered_peers_.back().set_ip_port(from);
            discovered_peers_.back().SetUserData(packet.user_data(),
                                                 packet.snapshot_index());
            discovered_peers_.back().set_last_updated(cur_time_ms);
          } else {
            bool update_user_data =
                ((*find_it).last_received_packet() < packet.snapshot_index());
            if (update_user_data) {
              (*find_it).SetUserData(packet.user_data(),
                                     packet.snapshot_index());
            }
            (*find_it).set_last_updated(cur_time_ms);
          }
        } else if (packet.packet_type() == kPacketIAmOutOfHere) {
          if (find_it != discovered_peers_.end()) {
            discovered_peers_.erase(find_it);
          }
        }

        lock_.Unlock();
      }
    }
  }